

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::cr(Forth *this)

{
  Forth *this_local;
  
  if (this->writeToTarget == ToString) {
    std::ostream::operator<<((ostream *)&this->field_0x20,std::endl<char,std::char_traits<char>>);
  }
  else if (this->writeToTarget == ToStdCout) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  return;
}

Assistant:

void cr() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << std::endl;
				break;
			case ToStdCout:
				std::cout << std::endl;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}